

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

result_type __thiscall
anon_unknown.dwarf_b8b207::ByTimeViewExtractor::operator()
          (ByTimeViewExtractor *this,Announcement *ann)

{
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  result_type rVar3;
  
  uVar2 = *(ulong *)(this + 0x30) >> 0x3d;
  uVar1 = (ulong)((uVar2 - 1 < 2) + 1);
  if (uVar2 == 3) {
    uVar1 = 0;
  }
  if (uVar2 == 0) {
    uVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    rVar3.second.__r = *(rep *)(this + 0x20);
    rVar3._0_8_ = uVar1;
    return rVar3;
  }
  __stack_chk_fail();
}

Assistant:

result_type operator()(const Announcement& ann) const
    {
        return ByTimeView{GetWaitState(ann), ann.m_time};
    }